

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params params,U64 pledgedSrcSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  bool bVar1;
  ldmParams_t params_00;
  ZSTD_CCtx_params ZVar2;
  U32 UVar3;
  uint uVar4;
  size_t sVar5;
  U64 UVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  ulong size;
  void *pvVar10;
  long lVar11;
  seqDef *psVar12;
  size_t __n;
  byte bVar13;
  undefined8 in_stack_fffffffffffffdf0;
  int local_120;
  size_t local_118;
  size_t local_110;
  ulong local_108;
  U64 local_100;
  ulong local_f8;
  U64 local_f0;
  size_t ldmBucketSize;
  size_t ldmHSize;
  int workSpaceWasteful;
  int workSpaceTooLarge;
  int workSpaceTooSmall;
  size_t neededSpace;
  size_t ldmSeqSpace;
  size_t ldmSpace;
  size_t bufferSpace;
  size_t blockStateSpace;
  size_t entropySpace;
  void *ptr;
  size_t maxNbLdmSeq;
  size_t matchStateSize;
  size_t buffInSize;
  size_t buffOutSize;
  size_t tokenSpace;
  size_t maxNbSeq;
  U32 divider;
  size_t blockSize;
  size_t windowSize;
  ZSTD_buffered_policy_e zbuff_local;
  ZSTD_compResetPolicy_e crp_local;
  U64 pledgedSrcSize_local;
  ZSTD_CCtx *zc_local;
  
  if (crp == ZSTDcrp_continue) {
    in_stack_fffffffffffffdf0._0_4_ = (zc->appliedParams).cParams.targetLength;
    in_stack_fffffffffffffdf0._4_4_ = (zc->appliedParams).cParams.strategy;
    UVar3 = ZSTD_equivalentParams
                      (zc->appliedParams,params,zc->inBuffSize,(zc->seqStore).maxNbSeq,
                       (zc->seqStore).maxNbLit,zbuff,pledgedSrcSize);
    if ((UVar3 != 0) &&
       (zc->workSpaceOversizedDuration =
             (uint)(0 < zc->workSpaceOversizedDuration) + zc->workSpaceOversizedDuration,
       zc->workSpaceOversizedDuration < 0x81)) {
      sVar5 = ZSTD_continueCCtx(zc,params,pledgedSrcSize);
      return sVar5;
    }
  }
  if (params.ldmParams.enableLdm != 0) {
    ZSTD_ldm_adjustParameters(&params.ldmParams,&params.cParams);
    UVar6 = ZSTD_rollingHash_primePower(params.ldmParams.minMatchLength);
    (zc->ldmState).hashPower = UVar6;
  }
  bVar13 = (byte)params.cParams.windowLog;
  local_f0 = pledgedSrcSize;
  if ((ulong)(1L << (bVar13 & 0x3f)) < pledgedSrcSize) {
    local_f0 = 1L << (bVar13 & 0x3f);
  }
  if (local_f0 == 0) {
    local_f8 = 1;
  }
  else {
    local_100 = pledgedSrcSize;
    if ((ulong)(1L << (bVar13 & 0x3f)) < pledgedSrcSize) {
      local_100 = 1L << (bVar13 & 0x3f);
    }
    local_f8 = local_100;
  }
  if (local_f8 < 0x20001) {
    local_108 = local_f8;
  }
  else {
    local_108 = 0x20000;
  }
  uVar4 = 4;
  if (params.cParams.minMatch == 3) {
    uVar4 = 3;
  }
  uVar7 = local_108 / uVar4;
  if (zbuff == ZSTDb_buffered) {
    local_110 = ZSTD_compressBound(local_108);
    local_110 = local_110 + 1;
    local_118 = local_f8 + local_108;
  }
  else {
    local_110 = 0;
    local_118 = 0;
  }
  sVar5 = ZSTD_sizeof_matchState(&params.cParams,1);
  sVar8 = ZSTD_ldm_getMaxNbSeq(params.ldmParams,local_108);
  ZVar2 = params;
  params_00.hashRateLog = (int)in_stack_fffffffffffffdf0;
  params_00.windowLog = (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  params_00.enableLdm = params.ldmParams.bucketSizeLog;
  params_00.hashLog = params.ldmParams.minMatchLength;
  params_00.bucketSizeLog = params.ldmParams.hashRateLog;
  params_00.minMatchLength = params.ldmParams.windowLog;
  params = ZVar2;
  sVar9 = ZSTD_ldm_getTableSize(params_00);
  size = sVar9 + sVar8 * 0xc + sVar5 + local_108 + 0x3be8 + uVar7 * 0xb + local_118 + local_110;
  bVar1 = false;
  if (size * 3 < zc->workSpaceSize) {
    bVar1 = 0x80 < zc->workSpaceOversizedDuration;
    local_120 = zc->workSpaceOversizedDuration + 1;
  }
  else {
    local_120 = 0;
  }
  zc->workSpaceOversizedDuration = local_120;
  if ((zc->workSpaceSize < size) || (bVar1)) {
    if (zc->staticSize != 0) {
      return 0xffffffffffffffc0;
    }
    zc->workSpaceSize = 0;
    ZSTD_free(zc->workSpace,zc->customMem);
    pvVar10 = ZSTD_malloc(size,zc->customMem);
    zc->workSpace = pvVar10;
    if (zc->workSpace == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    zc->workSpaceSize = size;
    zc->workSpaceOversizedDuration = 0;
    (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)zc->workSpace;
    (zc->blockState).nextCBlock = (zc->blockState).prevCBlock + 1;
    zc->entropyWorkspace = (U32 *)((zc->blockState).nextCBlock + 1);
  }
  memcpy(&zc->appliedParams,&params,0x80);
  ZVar2 = params;
  (zc->blockState).matchState.cParams.windowLog = params.cParams.windowLog;
  (zc->blockState).matchState.cParams.chainLog = params.cParams.chainLog;
  params.cParams._8_8_ = ZVar2.cParams._8_8_;
  (zc->blockState).matchState.cParams.hashLog = params.cParams.hashLog;
  (zc->blockState).matchState.cParams.searchLog = params.cParams.searchLog;
  params.cParams._16_8_ = ZVar2.cParams._16_8_;
  (zc->blockState).matchState.cParams.minMatch = params.cParams.minMatch;
  (zc->blockState).matchState.cParams.targetLength = params.cParams.targetLength;
  params.cParams.strategy = ZVar2.cParams.strategy;
  (zc->blockState).matchState.cParams.strategy = params.cParams.strategy;
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize == 0xffffffffffffffff) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = local_108;
  params = ZVar2;
  XXH64_reset(&zc->xxhState,0);
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  ZSTD_reset_compressedBlockState((zc->blockState).prevCBlock);
  entropySpace = (size_t)(zc->entropyWorkspace + 0x600);
  if (params.ldmParams.enableLdm != 0) {
    lVar11 = 1L << ((byte)params.ldmParams.hashLog & 0x3f);
    memset((void *)entropySpace,0,lVar11 << 3);
    (zc->ldmState).hashTable = (ldmEntry_t *)entropySpace;
    zc->ldmSequences = (rawSeq *)((zc->ldmState).hashTable + lVar11);
    entropySpace = (size_t)(zc->ldmSequences + sVar8);
    zc->maxNbLdmSequences = sVar8;
    memset(&zc->ldmState,0,0x20);
  }
  psVar12 = (seqDef *)
            ZSTD_reset_matchState
                      (&(zc->blockState).matchState,(void *)entropySpace,&params.cParams,crp,1);
  (zc->seqStore).maxNbSeq = uVar7;
  (zc->seqStore).sequencesStart = psVar12;
  (zc->seqStore).llCode = (BYTE *)((zc->seqStore).sequencesStart + uVar7);
  (zc->seqStore).mlCode = (zc->seqStore).llCode + uVar7;
  (zc->seqStore).ofCode = (zc->seqStore).mlCode + uVar7;
  (zc->seqStore).litStart = (zc->seqStore).ofCode + uVar7;
  (zc->seqStore).maxNbLit = local_108;
  entropySpace = (size_t)((zc->seqStore).litStart + local_108 + 8);
  if (params.ldmParams.enableLdm != 0) {
    __n = 1L << ((char)params.ldmParams.hashLog - (char)params.ldmParams.bucketSizeLog & 0x3fU);
    memset((void *)entropySpace,0,__n);
    (zc->ldmState).bucketOffsets = (BYTE *)entropySpace;
    entropySpace = (size_t)((zc->ldmState).bucketOffsets + __n);
    ZSTD_window_clear(&(zc->ldmState).window);
  }
  ZSTD_referenceExternalSequences(zc,(rawSeq *)0x0,0);
  zc->inBuffSize = local_118;
  zc->inBuff = (char *)entropySpace;
  zc->outBuffSize = local_110;
  zc->outBuff = zc->inBuff + local_118;
  return 0;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params params,
                                      U64 pledgedSrcSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u",
                (U32)pledgedSrcSize, params.cParams.windowLog);
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));

    if (crp == ZSTDcrp_continue) {
        if (ZSTD_equivalentParams(zc->appliedParams, params,
                                  zc->inBuffSize,
                                  zc->seqStore.maxNbSeq, zc->seqStore.maxNbLit,
                                  zbuff, pledgedSrcSize)) {
            DEBUGLOG(4, "ZSTD_equivalentParams()==1 -> continue mode (wLog1=%u, blockSize1=%zu)",
                        zc->appliedParams.cParams.windowLog, zc->blockSize);
            zc->workSpaceOversizedDuration += (zc->workSpaceOversizedDuration > 0);   /* if it was too large, it still is */
            if (zc->workSpaceOversizedDuration <= ZSTD_WORKSPACETOOLARGE_MAXDURATION)
                return ZSTD_continueCCtx(zc, params, pledgedSrcSize);
    }   }
    DEBUGLOG(4, "ZSTD_equivalentParams()==0 -> reset CCtx");

    if (params.ldmParams.enableLdm) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&params.ldmParams, &params.cParams);
        assert(params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog);
        assert(params.ldmParams.hashRateLog < 32);
        zc->ldmState.hashPower = ZSTD_rollingHash_primePower(params.ldmParams.minMatchLength);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params.cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, windowSize);
        U32    const divider = (params.cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const tokenSpace = WILDCOPY_OVERLENGTH + blockSize + 11*maxNbSeq;
        size_t const buffOutSize = (zbuff==ZSTDb_buffered) ? ZSTD_compressBound(blockSize)+1 : 0;
        size_t const buffInSize = (zbuff==ZSTDb_buffered) ? windowSize + blockSize : 0;
        size_t const matchStateSize = ZSTD_sizeof_matchState(&params.cParams, /* forCCtx */ 1);
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params.ldmParams, blockSize);
        void* ptr;   /* used to partition workSpace */

        /* Check if workSpace is large enough, alloc a new one if needed */
        {   size_t const entropySpace = HUF_WORKSPACE_SIZE;
            size_t const blockStateSpace = 2 * sizeof(ZSTD_compressedBlockState_t);
            size_t const bufferSpace = buffInSize + buffOutSize;
            size_t const ldmSpace = ZSTD_ldm_getTableSize(params.ldmParams);
            size_t const ldmSeqSpace = maxNbLdmSeq * sizeof(rawSeq);

            size_t const neededSpace = entropySpace + blockStateSpace + ldmSpace +
                                       ldmSeqSpace + matchStateSize + tokenSpace +
                                       bufferSpace;

            int const workSpaceTooSmall = zc->workSpaceSize < neededSpace;
            int const workSpaceTooLarge = zc->workSpaceSize > ZSTD_WORKSPACETOOLARGE_FACTOR * neededSpace;
            int const workSpaceWasteful = workSpaceTooLarge && (zc->workSpaceOversizedDuration > ZSTD_WORKSPACETOOLARGE_MAXDURATION);
            zc->workSpaceOversizedDuration = workSpaceTooLarge ? zc->workSpaceOversizedDuration+1 : 0;

            DEBUGLOG(4, "Need %zuKB workspace, including %zuKB for match state, and %zuKB for buffers",
                        neededSpace>>10, matchStateSize>>10, bufferSpace>>10);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (workSpaceTooSmall || workSpaceWasteful) {
                DEBUGLOG(4, "Need to resize workSpaceSize from %zuKB to %zuKB",
                            zc->workSpaceSize >> 10,
                            neededSpace >> 10);
                /* static cctx : no resize, error out */
                if (zc->staticSize) return ERROR(memory_allocation);

                zc->workSpaceSize = 0;
                ZSTD_free(zc->workSpace, zc->customMem);
                zc->workSpace = ZSTD_malloc(neededSpace, zc->customMem);
                if (zc->workSpace == NULL) return ERROR(memory_allocation);
                zc->workSpaceSize = neededSpace;
                zc->workSpaceOversizedDuration = 0;

                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(((size_t)zc->workSpace & 3) == 0);   /* ensure correct alignment */
                assert(zc->workSpaceSize >= 2 * sizeof(ZSTD_compressedBlockState_t));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)zc->workSpace;
                zc->blockState.nextCBlock = zc->blockState.prevCBlock + 1;
                ptr = zc->blockState.nextCBlock + 1;
                zc->entropyWorkspace = (U32*)ptr;
        }   }

        /* init params */
        zc->appliedParams = params;
        zc->blockState.matchState.cParams = params.cParams;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        ptr = zc->entropyWorkspace + HUF_WORKSPACE_SIZE_U32;

        /* ldm hash table */
        /* initialize bucketOffsets table later for pointer alignment */
        if (params.ldmParams.enableLdm) {
            size_t const ldmHSize = ((size_t)1) << params.ldmParams.hashLog;
            memset(ptr, 0, ldmHSize * sizeof(ldmEntry_t));
            assert(((size_t)ptr & 3) == 0); /* ensure ptr is properly aligned */
            zc->ldmState.hashTable = (ldmEntry_t*)ptr;
            ptr = zc->ldmState.hashTable + ldmHSize;
            zc->ldmSequences = (rawSeq*)ptr;
            ptr = zc->ldmSequences + maxNbLdmSeq;
            zc->maxNbLdmSequences = maxNbLdmSeq;

            memset(&zc->ldmState.window, 0, sizeof(zc->ldmState.window));
        }
        assert(((size_t)ptr & 3) == 0); /* ensure ptr is properly aligned */

        ptr = ZSTD_reset_matchState(&zc->blockState.matchState, ptr, &params.cParams, crp, /* forCCtx */ 1);

        /* sequences storage */
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.sequencesStart = (seqDef*)ptr;
        ptr = zc->seqStore.sequencesStart + maxNbSeq;
        zc->seqStore.llCode = (BYTE*) ptr;
        zc->seqStore.mlCode = zc->seqStore.llCode + maxNbSeq;
        zc->seqStore.ofCode = zc->seqStore.mlCode + maxNbSeq;
        zc->seqStore.litStart = zc->seqStore.ofCode + maxNbSeq;
        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.maxNbLit = blockSize;
        ptr = zc->seqStore.litStart + blockSize + WILDCOPY_OVERLENGTH;

        /* ldm bucketOffsets table */
        if (params.ldmParams.enableLdm) {
            size_t const ldmBucketSize =
                  ((size_t)1) << (params.ldmParams.hashLog -
                                  params.ldmParams.bucketSizeLog);
            memset(ptr, 0, ldmBucketSize);
            zc->ldmState.bucketOffsets = (BYTE*)ptr;
            ptr = zc->ldmState.bucketOffsets + ldmBucketSize;
            ZSTD_window_clear(&zc->ldmState.window);
        }
        ZSTD_referenceExternalSequences(zc, NULL, 0);

        /* buffers */
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ptr;
        zc->outBuffSize = buffOutSize;
        zc->outBuff = zc->inBuff + buffInSize;

        return 0;
    }
}